

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzhamtest.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  uint uVar1;
  int iVar2;
  long lVar3;
  allocator<char> local_179;
  string_array cmd_line;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_160;
  ilzham local_148;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  printf("LZHAM Codec - x64 Command Line Test App - Compiled %s %s\n","Apr 26 2025","23:07:53");
  printf("Expecting LZHAM DLL Version 0x%04X\n",0x1011);
  local_148._vptr_ilzham = (_func_int **)&PTR__ilzham_0010bc40;
  local_148.lzham_get_version = lzham_get_version;
  local_148.lzham_set_memory_callbacks = lzham_set_memory_callbacks;
  local_148.lzham_compress_init = lzham_compress_init;
  local_148.lzham_compress_deinit = lzham_compress_deinit;
  local_148.lzham_compress = lzham_compress;
  local_148.lzham_compress2 = lzham_compress2;
  local_148.lzham_compress_reinit = lzham_compress_reinit;
  local_148.lzham_compress_memory = lzham_compress_memory;
  local_148.lzham_decompress_init = lzham_decompress_init;
  local_148.lzham_decompress_reinit = lzham_decompress_reinit;
  local_148.lzham_decompress_deinit = lzham_decompress_deinit;
  local_148.lzham_decompress = lzham_decompress;
  local_148.lzham_decompress_memory = lzham_decompress_memory;
  local_148.lzham_z_version = lzham_z_version;
  local_148.lzham_z_deflateInit = lzham_z_deflateInit;
  local_148.lzham_z_deflateInit2 = lzham_z_deflateInit2;
  local_148.lzham_z_deflateReset = lzham_z_deflateReset;
  local_148.lzham_z_deflate = lzham_z_deflate;
  local_148.lzham_z_deflateEnd = lzham_z_deflateEnd;
  local_148.lzham_z_deflateBound = lzham_z_deflateBound;
  local_148.lzham_z_compress = lzham_z_compress;
  local_148.lzham_z_compress2 = lzham_z_compress2;
  local_148.lzham_z_compressBound = lzham_z_compressBound;
  local_148.lzham_z_inflateInit = lzham_z_inflateInit;
  local_148.lzham_z_inflateInit2 = lzham_z_inflateInit2;
  local_148.lzham_z_inflate = lzham_z_inflate;
  local_148.lzham_z_inflateEnd = lzham_z_inflateEnd;
  local_148.lzham_z_inflateReset = lzham_z_inflateReset;
  local_148.lzham_z_uncompress = lzham_z_uncompress;
  local_148.lzham_z_error = lzham_z_error;
  puts("Using static libraries.");
  uVar1 = lzham_get_version();
  printf("Loaded LZHAM DLL version 0x%04X\n\n",(ulong)uVar1);
  cmd_line.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  cmd_line.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  cmd_line.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  for (lVar3 = 1; lVar3 < argc; lVar3 = lVar3 + 1) {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,argv[lVar3],&local_179);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&cmd_line,
               &local_50);
    std::__cxx11::string::~string((string *)&local_50);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_160,&cmd_line);
  iVar2 = main_internal(&local_160,-1,&local_148);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_160);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&cmd_line);
  return iVar2;
}

Assistant:

int main(int argc, char *argv[])
#endif
{
   (void)g_is_debug;

#ifdef _XBOX
   int argc = 3;
   char *argv[4] = { "", "A", "E:\\samples", "" };

   DmMapDevkitDrive();
#endif

#ifdef LZHAM_64BIT
   printf("LZHAM Codec - x64 Command Line Test App - Compiled %s %s\n", __DATE__, __TIME__);
#else
   printf("LZHAM Codec - x86 Command Line Test App - Compiled %s %s\n", __DATE__, __TIME__);
#endif

   printf("Expecting LZHAM DLL Version 0x%04X\n", LZHAM_DLL_VERSION);

#if LZHAM_STATIC_LIB
   lzham_static_lib lzham_lib;
   lzham_lib.load();
   printf("Using static libraries.\n");
#else
   lzham_dll_loader lzham_lib;
   char lzham_dll_filename[MAX_PATH];
   lzham_dll_loader::create_module_path(lzham_dll_filename, MAX_PATH, g_is_debug);
   printf("Dynamically loading DLL \"%s\"\n", lzham_dll_filename);

   HRESULT hres = lzham_lib.load(lzham_dll_filename);
   if (FAILED(hres))
   {
      print_error("Failed loading LZHAM DLL (Status=0x%04X)!\n", (uint)hres);
      return EXIT_FAILURE;
   }
#endif

   // -1 = auto-detection
   int num_helper_threads = -1;

#ifdef _XBOX
   num_helper_threads = 5;
#elif defined(WIN32)
   SYSTEM_INFO g_system_info;
   GetSystemInfo(&g_system_info);
   if (g_system_info.dwNumberOfProcessors > 1)
   {
      num_helper_threads = g_system_info.dwNumberOfProcessors - 1;
   }
#endif

   printf("Loaded LZHAM DLL version 0x%04X\n\n", lzham_lib.lzham_get_version());

   string_array cmd_line;
   for (int i = 1; i < argc; i++)
   {
      cmd_line.push_back(std::string(argv[i]));
   }

   int exit_status = main_internal(cmd_line, num_helper_threads, lzham_lib);

   lzham_lib.unload();

   return exit_status;
}